

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

int linenoiseHistoryAdd(char *line)

{
  int iVar1;
  char **__dest;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  
  iVar1 = history_max_len;
  if ((((history != (char **)0x0) ||
       (history = (char **)calloc(1,(ulong)(uint)history_max_len * 8), history != (char **)0x0)) &&
      ((__dest = history, uVar4 = history_len, (long)history_len == 0 ||
       (iVar2 = strcmp(history[(long)history_len + -1],line), iVar2 != 0)))) &&
     (pcVar3 = strdup(line), pcVar3 != (char *)0x0)) {
    if (uVar4 == iVar1) {
      free(*__dest);
      uVar4 = iVar1 - 1;
      memmove(__dest,__dest + 1,(ulong)uVar4 * 8);
    }
    __dest[(int)uVar4] = pcVar3;
    history_len = uVar4 + 1;
    return 1;
  }
  return 0;
}

Assistant:

int linenoiseHistoryAdd(const char *line) {
    char *linecopy;

    if (history_max_len == 0) return 0;

    /* Initialization on first call. */
    if (history == NULL) {
        history = malloc(sizeof(char*)*history_max_len);
        if (history == NULL) return 0;
        memset(history,0,(sizeof(char*)*history_max_len));
    }

    /* Don't add duplicated lines. */
    if (history_len && !strcmp(history[history_len-1], line)) return 0;

    /* Add an heap allocated copy of the line in the history.
     * If we reached the max length, remove the older line. */
    linecopy = strdup(line);
    if (!linecopy) return 0;
    if (history_len == history_max_len) {
        free(history[0]);
        memmove(history,history+1,sizeof(char*)*(history_max_len-1));
        history_len--;
    }
    history[history_len] = linecopy;
    history_len++;
    return 1;
}